

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.hpp
# Opt level: O1

void __thiscall libtorrent::aux::rc4_handler::~rc4_handler(rc4_handler *this)

{
  operator_delete(this,0x220);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT rc4_handler : crypto_plugin
	{
	public:
		rc4_handler();

		// Input keys must be 20 bytes
		void set_incoming_key(span<char const> key) override;
		void set_outgoing_key(span<char const> key) override;

		std::tuple<int, span<span<char const>>>
		encrypt(span<span<char>> buf) override;

		std::tuple<int, int, int> decrypt(span<span<char>> buf) override;

	private:
		rc4 m_rc4_incoming;
		rc4 m_rc4_outgoing;

		// determines whether or not encryption and decryption is enabled
		bool m_encrypt;
		bool m_decrypt;
	}